

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess.h
# Opt level: O3

pair<int,_int> subprocess::util::pipe_cloexec(void)

{
  pair<int,_int> pVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  OSError *this;
  int *piVar5;
  long in_FS_OFFSET;
  int pipe_fds [2];
  string local_50;
  int local_30;
  int iStack_2c;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = pipe(&local_30);
  iVar2 = local_30;
  if (iVar3 == 0) {
    uVar4 = fcntl(local_30,1,0);
    fcntl(iVar2,2,(ulong)(uVar4 | 1));
    iVar2 = iStack_2c;
    uVar4 = fcntl(iStack_2c,1,0);
    fcntl(iVar2,2,(ulong)(uVar4 | 1));
    pVar1.second = iStack_2c;
    pVar1.first = local_30;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return pVar1;
    }
  }
  else {
    this = (OSError *)__cxa_allocate_exception(0x10);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"pipe failure","");
    piVar5 = __errno_location();
    OSError::OSError(this,&local_50,*piVar5);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      __cxa_throw(this,&OSError::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  __stack_chk_fail();
}

Assistant:

static inline
  std::pair<int, int> pipe_cloexec() noexcept(false)
  {
    int pipe_fds[2];
    int res = pipe(pipe_fds);
    if (res) {
      throw OSError("pipe failure", errno);
    }

    set_clo_on_exec(pipe_fds[0]);
    set_clo_on_exec(pipe_fds[1]);

    return std::make_pair(pipe_fds[0], pipe_fds[1]);
  }